

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall Gc::registerThread(Gc *this,uint64_t threadId)

{
  byte bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  bool bVar4;
  Iterator IVar5;
  
  IVar5 = axl::sl::
          HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
          ::visit(&this->m_threadMap,threadId);
  bVar1 = *(byte *)((long)IVar5.
                          super_IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
                          .
                          super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
                          .m_p + 0x18);
  if (bVar1 == 0) {
    sVar2 = (this->m_threadArray).
            super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_count;
    bVar4 = axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::
            setCountImpl<axl::sl::SimpleArrayDetails<unsigned_long>::Construct>
                      (&this->m_threadArray,sVar2 + 1);
    puVar3 = (this->m_threadArray).
             super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p;
    if (puVar3 != (unsigned_long *)0x0 && bVar4) {
      puVar3[sVar2] = threadId;
    }
    *(undefined1 *)
     ((long)IVar5.
            super_IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
            .
            super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
            .m_p + 0x18) = 1;
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool
	registerThread(uint64_t threadId) {
		sl::HashTableIterator<uint64_t, bool> it = m_threadMap.visit(threadId);
		if (it->m_value)
			return false;

		m_threadArray.append(threadId);
		it->m_value = true;
		return true;
	}